

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_vertex_attrib_64bit(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_vertex_attrib_64bit != 0) {
    glad_glVertexAttribL1dEXT = (PFNGLVERTEXATTRIBL1DEXTPROC)(*load)("glVertexAttribL1dEXT");
    glad_glVertexAttribL2dEXT = (PFNGLVERTEXATTRIBL2DEXTPROC)(*load)("glVertexAttribL2dEXT");
    glad_glVertexAttribL3dEXT = (PFNGLVERTEXATTRIBL3DEXTPROC)(*load)("glVertexAttribL3dEXT");
    glad_glVertexAttribL4dEXT = (PFNGLVERTEXATTRIBL4DEXTPROC)(*load)("glVertexAttribL4dEXT");
    glad_glVertexAttribL1dvEXT = (PFNGLVERTEXATTRIBL1DVEXTPROC)(*load)("glVertexAttribL1dvEXT");
    glad_glVertexAttribL2dvEXT = (PFNGLVERTEXATTRIBL2DVEXTPROC)(*load)("glVertexAttribL2dvEXT");
    glad_glVertexAttribL3dvEXT = (PFNGLVERTEXATTRIBL3DVEXTPROC)(*load)("glVertexAttribL3dvEXT");
    glad_glVertexAttribL4dvEXT = (PFNGLVERTEXATTRIBL4DVEXTPROC)(*load)("glVertexAttribL4dvEXT");
    glad_glVertexAttribLPointerEXT =
         (PFNGLVERTEXATTRIBLPOINTEREXTPROC)(*load)("glVertexAttribLPointerEXT");
    glad_glGetVertexAttribLdvEXT =
         (PFNGLGETVERTEXATTRIBLDVEXTPROC)(*load)("glGetVertexAttribLdvEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_vertex_attrib_64bit(GLADloadproc load) {
	if(!GLAD_GL_EXT_vertex_attrib_64bit) return;
	glad_glVertexAttribL1dEXT = (PFNGLVERTEXATTRIBL1DEXTPROC)load("glVertexAttribL1dEXT");
	glad_glVertexAttribL2dEXT = (PFNGLVERTEXATTRIBL2DEXTPROC)load("glVertexAttribL2dEXT");
	glad_glVertexAttribL3dEXT = (PFNGLVERTEXATTRIBL3DEXTPROC)load("glVertexAttribL3dEXT");
	glad_glVertexAttribL4dEXT = (PFNGLVERTEXATTRIBL4DEXTPROC)load("glVertexAttribL4dEXT");
	glad_glVertexAttribL1dvEXT = (PFNGLVERTEXATTRIBL1DVEXTPROC)load("glVertexAttribL1dvEXT");
	glad_glVertexAttribL2dvEXT = (PFNGLVERTEXATTRIBL2DVEXTPROC)load("glVertexAttribL2dvEXT");
	glad_glVertexAttribL3dvEXT = (PFNGLVERTEXATTRIBL3DVEXTPROC)load("glVertexAttribL3dvEXT");
	glad_glVertexAttribL4dvEXT = (PFNGLVERTEXATTRIBL4DVEXTPROC)load("glVertexAttribL4dvEXT");
	glad_glVertexAttribLPointerEXT = (PFNGLVERTEXATTRIBLPOINTEREXTPROC)load("glVertexAttribLPointerEXT");
	glad_glGetVertexAttribLdvEXT = (PFNGLGETVERTEXATTRIBLDVEXTPROC)load("glGetVertexAttribLdvEXT");
}